

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuStreamMessage::iuStreamMessage(iuStreamMessage *this,iuStreamMessage *rhs)

{
  string local_38;
  iuStreamMessage *local_18;
  iuStreamMessage *rhs_local;
  iuStreamMessage *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  GetString_abi_cxx11_(&local_38,rhs);
  iu_global_format_stringstream::iu_global_format_stringstream(&this->m_stream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

iuStreamMessage(const iuStreamMessage& rhs) : m_stream(rhs.GetString()) {}